

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O1

TimeData *
helics::generateMinTimeUpstream
          (TimeData *__return_storage_ptr__,TimeDependencies *dependencies,bool restricted,
          GlobalFederateId self,GlobalFederateId ignore,int32_t responseCode)

{
  pointer pDVar1;
  long lVar2;
  int iVar3;
  DependencyInfo *dep;
  pointer dep_00;
  
  (__return_storage_ptr__->next).internalTimeCode = 0x7fffffffffffffff;
  (__return_storage_ptr__->Te).internalTimeCode = 0x7fffffffffffffff;
  (__return_storage_ptr__->minDe).internalTimeCode = 0x7fffffffffffffff;
  (__return_storage_ptr__->TeAlt).internalTimeCode = 0x7fffffffffffffff;
  (__return_storage_ptr__->lastGrant).internalTimeCode = 0;
  __return_storage_ptr__->minFed = -2010000000;
  __return_storage_ptr__->minFedActual = -2010000000;
  __return_storage_ptr__->mTimeState = error;
  __return_storage_ptr__->hasData = false;
  __return_storage_ptr__->interrupted = false;
  __return_storage_ptr__->delayedTiming = false;
  __return_storage_ptr__->timingVersion = -2;
  __return_storage_ptr__->restrictionLevel = '\0';
  __return_storage_ptr__->timeoutCount = 0;
  __return_storage_ptr__->sequenceCounter = 0;
  __return_storage_ptr__->responseSequenceCounter = 0;
  __return_storage_ptr__->grantedIteration = 0;
  dep_00 = (dependencies->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (dependencies->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (dep_00 == pDVar1) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    do {
      if (((dep_00->dependency == true) && (dep_00->connection != PARENT)) &&
         ((self.gid == -2010000000 ||
          ((self.gid == -1700000000 || ((dep_00->super_TimeData).minFedActual.gid != self.gid))))))
      {
        iVar3 = iVar3 + (dep_00->super_TimeData).sequenceCounter;
        generateMinTimeImplementation(__return_storage_ptr__,dep_00,ignore,responseCode);
      }
      dep_00 = dep_00 + 1;
    } while (dep_00 != pDVar1);
  }
  lVar2 = (__return_storage_ptr__->Te).internalTimeCode;
  if (lVar2 < (__return_storage_ptr__->minDe).internalTimeCode) {
    (__return_storage_ptr__->minDe).internalTimeCode = lVar2;
  }
  if ((!restricted) &&
     (lVar2 = (__return_storage_ptr__->minDe).internalTimeCode,
     (__return_storage_ptr__->next).internalTimeCode < lVar2)) {
    (__return_storage_ptr__->next).internalTimeCode = lVar2;
  }
  __return_storage_ptr__->sequenceCounter = iVar3;
  if (__return_storage_ptr__->mTimeState < time_granted) {
    *(undefined4 *)&(__return_storage_ptr__->next).internalTimeCode = 0xffffffff;
    *(undefined4 *)((long)&(__return_storage_ptr__->next).internalTimeCode + 4) = 0xffffffff;
    *(undefined4 *)&(__return_storage_ptr__->Te).internalTimeCode = 0xffffffff;
    *(undefined4 *)((long)&(__return_storage_ptr__->Te).internalTimeCode + 4) = 0xffffffff;
    (__return_storage_ptr__->minDe).internalTimeCode = -1;
  }
  return __return_storage_ptr__;
}

Assistant:

TimeData generateMinTimeUpstream(const TimeDependencies& dependencies,
                                 bool restricted,
                                 GlobalFederateId self,
                                 GlobalFederateId ignore,
                                 std::int32_t responseCode)
{
    TimeData mTime(Time::maxVal(), TimeState::error);
    std::int32_t iterationCount{0};
    for (const auto& dep : dependencies) {
        if (!dep.dependency) {
            continue;
        }
        if (dep.connection == ConnectionType::PARENT) {
            continue;
        }
        if (self.isValid() && dep.minFedActual == self) {
            continue;
        }
        iterationCount += dep.sequenceCounter;
        generateMinTimeImplementation(mTime, dep, ignore, responseCode);
    }
    if (mTime.Te < mTime.minDe) {
        mTime.minDe = mTime.Te;
    }

    if (!restricted) {
        if (mTime.minDe > mTime.next) {
            mTime.next = mTime.minDe;
        }
    }
    mTime.sequenceCounter = iterationCount;
    if (mTime.mTimeState < TimeState::time_granted) {
        mTime.next = initializationTime;
        mTime.minDe = initializationTime;
        mTime.Te = initializationTime;
    }
    return mTime;
}